

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O2

bool deqp::gles31::Functional::anon_unknown_1::BinaryAtomicOperationCase::ReturnValueVerifier::
     verifyRecursive<int>
               (AtomicOperation operation,int index,int valueSoFar,bool (*argsUsed) [5],
               int (*args) [5],int (*returnValues) [5])

{
  bool bVar1;
  int valueSoFar_00;
  int i;
  long lVar2;
  bool bVar3;
  
  bVar3 = true;
  if (index < 5) {
    for (lVar2 = 0; bVar3 = lVar2 != 5, bVar3; lVar2 = lVar2 + 1) {
      if (((*argsUsed)[lVar2] == false) && ((*returnValues)[lVar2] == valueSoFar)) {
        (*argsUsed)[lVar2] = true;
        valueSoFar_00 = computeBinaryAtomicOperationResult(operation,valueSoFar,(*args)[lVar2]);
        bVar1 = verifyRecursive<int>(operation,index + 1,valueSoFar_00,argsUsed,args,returnValues);
        if (bVar1) {
          return bVar3;
        }
        (*argsUsed)[lVar2] = false;
      }
    }
  }
  return bVar3;
}

Assistant:

static bool verifyRecursive (AtomicOperation operation, int index, T valueSoFar, bool (&argsUsed)[NUM_INVOCATIONS_PER_PIXEL], const T (&args)[NUM_INVOCATIONS_PER_PIXEL], const T (&returnValues)[NUM_INVOCATIONS_PER_PIXEL])
	{
		if (index < NUM_INVOCATIONS_PER_PIXEL)
		{
			for (int i = 0; i < NUM_INVOCATIONS_PER_PIXEL; i++)
			{
				if (!argsUsed[i] && compare(returnValues[i], valueSoFar))
				{
					argsUsed[i] = true;
					if (verifyRecursive(operation, index+1, computeBinaryAtomicOperationResult(operation, valueSoFar, args[i]), argsUsed, args, returnValues))
						return true;
					argsUsed[i] = false;
				}
			}

			return false;
		}
		else
			return true;
	}